

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O0

MatchResult __thiscall r_exec::PGMOverlay::match(PGMOverlay *this,View *input,uint16_t *input_index)

{
  uint16_t *input_00;
  bool bVar1;
  MatchResult MVar2;
  unsigned_short *puVar3;
  undefined1 auStack_70 [4];
  MatchResult r;
  iterator local_60;
  undefined1 local_50 [8];
  const_iterator it;
  bool failed;
  P<r_code::View> local_30;
  unsigned_short *local_28;
  uint16_t *input_index_local;
  View *input_local;
  PGMOverlay *this_local;
  
  local_28 = input_index;
  input_index_local = (uint16_t *)input;
  input_local = (View *)this;
  core::P<r_code::View>::P(&local_30,&input->super_View);
  std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>::push_back
            (&this->input_views,&local_30);
  core::P<r_code::View>::~P(&local_30);
  it._list._3_1_ = 0;
  r_code::list<unsigned_short>::const_iterator::const_iterator((const_iterator *)local_50);
  local_60 = r_code::list<unsigned_short>::begin(&this->input_pattern_indices);
  r_code::list<unsigned_short>::const_iterator::operator=((const_iterator *)local_50,&local_60);
  while( true ) {
    _auStack_70 = r_code::list<unsigned_short>::end(&this->input_pattern_indices);
    bVar1 = r_code::list<unsigned_short>::_iterator::operator!=
                      ((_iterator *)local_50,(_iterator *)auStack_70);
    input_00 = input_index_local;
    if (!bVar1) {
      std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>::pop_back
                (&this->input_views);
      this_local._4_4_ = IMPOSSIBLE;
      if ((it._list._3_1_ & 1) != 0) {
        this_local._4_4_ = FAILURE;
      }
      return this_local._4_4_;
    }
    puVar3 = r_code::list<unsigned_short>::const_iterator::operator*((const_iterator *)local_50);
    MVar2 = _match(this,(View *)input_00,*puVar3);
    if (MVar2 == SUCCESS) break;
    if (MVar2 == FAILURE) {
      it._list._3_1_ = 1;
      Overlay::rollback((Overlay *)this);
    }
    r_code::list<unsigned_short>::const_iterator::operator++((const_iterator *)local_50);
  }
  puVar3 = r_code::list<unsigned_short>::const_iterator::operator*((const_iterator *)local_50);
  *local_28 = *puVar3;
  r_code::list<unsigned_short>::erase(&this->input_pattern_indices,(const_iterator *)local_50);
  return SUCCESS;
}

Assistant:

PGMOverlay::MatchResult PGMOverlay::match(r_exec::View *input, uint16_t &input_index)
{
    input_views.push_back(input);
    bool failed = false;
    r_code::list<uint16_t>::const_iterator it;

    for (it = input_pattern_indices.begin(); it != input_pattern_indices.end(); ++it) {
        MatchResult r = _match(input, *it);

        switch (r) {
        case SUCCESS:
            input_index = *it;
            input_pattern_indices.erase(it);
            return r;

        case FAILURE:
            failed = true;
            rollback(); // to try another pattern on a clean basis.

        case IMPOSSIBLE:
            break;
        }
    }

    input_views.pop_back();
    return failed ? FAILURE : IMPOSSIBLE;
}